

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

result<sockpp::none> * __thiscall
sockpp::socket::set_option
          (result<sockpp::none> *__return_storage_ptr__,socket *this,int level,int optname,
          void *optval,socklen_t optlen)

{
  int iVar1;
  int *piVar2;
  error_category *peVar3;
  int iVar4;
  
  iVar1 = setsockopt(this->handle_,level,optname,optval,optlen);
  iVar4 = 0;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    iVar4 = *piVar2;
  }
  peVar3 = (error_category *)std::_V2::system_category();
  (__return_storage_ptr__->err_)._M_value = iVar4;
  (__return_storage_ptr__->err_)._M_cat = peVar3;
  return __return_storage_ptr__;
}

Assistant:

result<> socket::set_option(
    int level, int optname, const void* optval, socklen_t optlen
) noexcept {
#if defined(_WIN32)
    return check_res_none(
        ::setsockopt(
            handle_, level, optname, static_cast<const char*>(optval),
            static_cast<int>(optlen)
        )
    );
#else
    return check_res_none(::setsockopt(handle_, level, optname, optval, optlen));
#endif
}